

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgStatement.cpp
# Opt level: O2

void __thiscall
rsg::AssignStatement::tokenize(AssignStatement *this,GeneratorState *state,TokenStream *str)

{
  TokenStream *pTVar1;
  Token local_40;
  Token local_30;
  
  Token::Token(&local_30,(this->m_variable->m_name)._M_dataplus._M_p);
  pTVar1 = TokenStream::operator<<(str,&local_30);
  local_40.m_type = EQUAL;
  TokenStream::operator<<(pTVar1,&local_40);
  Token::~Token(&local_40);
  Token::~Token(&local_30);
  (*this->m_valueExpr->_vptr_Expression[3])(this->m_valueExpr,state,str);
  local_30.m_type = SEMICOLON;
  pTVar1 = TokenStream::operator<<(str,&local_30);
  local_40.m_type = NEWLINE;
  TokenStream::operator<<(pTVar1,&local_40);
  Token::~Token(&local_40);
  Token::~Token(&local_30);
  return;
}

Assistant:

void AssignStatement::tokenize (GeneratorState& state, TokenStream& str) const
{
	str << Token(m_variable->getName()) << Token::EQUAL;
	m_valueExpr->tokenize(state, str);
	str << Token::SEMICOLON << Token::NEWLINE;
}